

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char absl::lts_20250127::str_format_internal::anon_unknown_0::MultiplyBy10WithCarry<unsigned_long>
               (unsigned_long *v,char carry)

{
  char cVar1;
  unsigned_long uVar2;
  uint128 lhs;
  uint128 local_78;
  uint128 local_68;
  uint128 local_58;
  uint128 local_48;
  uint128 local_38;
  undefined1 local_28 [8];
  BiggerInt tmp;
  char carry_local;
  unsigned_long *v_local;
  
  tmp.hi_._7_1_ = carry;
  uint128::uint128(&local_48,10);
  uint128::uint128(&local_58,*v);
  local_38 = lts_20250127::operator*(local_48,local_58);
  uint128::uint128(&local_68,(int)tmp.hi_._7_1_);
  _local_28 = lts_20250127::operator+(local_38,local_68);
  uVar2 = uint128::operator_cast_to_unsigned_long((uint128 *)local_28);
  *v = uVar2;
  lhs.hi_ = 0x40;
  lhs.lo_ = tmp.lo_;
  local_78 = operator>>((lts_20250127 *)local_28,lhs,(int)uVar2);
  cVar1 = uint128::operator_cast_to_char(&local_78);
  return cVar1;
}

Assistant:

inline char MultiplyBy10WithCarry(Int* v, char carry) {
  using BiggerInt = absl::conditional_t<sizeof(Int) == 4, uint64_t, uint128>;
  BiggerInt tmp =
      10 * static_cast<BiggerInt>(*v) + static_cast<BiggerInt>(carry);
  *v = static_cast<Int>(tmp);
  return static_cast<char>(tmp >> (sizeof(Int) * 8));
}